

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_handshake.c
# Opt level: O0

void nn_ws_handshake_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  int iVar1;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  nn_ws_handshake *handshaker;
  undefined8 in_stack_ffffffffffffffb8;
  int type_00;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  long local_28;
  
  type_00 = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  local_28 = in_RDI;
  if (in_RDI == 0) {
    local_28 = 0;
  }
  if (in_ESI == 0xfffffffe && in_EDX == 0xfffffffd) {
    nn_timer_stop((nn_timer *)0x313e15);
    *(undefined4 *)(local_28 + 0x58) = 10;
  }
  if (*(int *)(local_28 + 0x58) == 10) {
    iVar1 = nn_timer_isidle((nn_timer *)0x313e48);
    if (iVar1 != 0) {
      *(undefined4 *)(local_28 + 0x58) = 1;
      nn_fsm_stopped((nn_fsm *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),type_00
                    );
    }
    return;
  }
  nn_backtrace_print();
  fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
          (ulong)*(uint *)(local_28 + 0x58),(ulong)in_ESI,(ulong)in_EDX,
          "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/ws_handshake.c"
          ,0x10a);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void nn_ws_handshake_shutdown (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_ws_handshake *handshaker;

    handshaker = nn_cont (self, struct nn_ws_handshake, fsm);

    if (nn_slow (src == NN_FSM_ACTION && type == NN_FSM_STOP)) {
        nn_timer_stop (&handshaker->timer);
        handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING;
    }
    if (nn_slow (handshaker->state == NN_WS_HANDSHAKE_STATE_STOPPING)) {
        if (!nn_timer_isidle (&handshaker->timer))
            return;
        handshaker->state = NN_WS_HANDSHAKE_STATE_IDLE;
        nn_fsm_stopped (&handshaker->fsm, NN_WS_HANDSHAKE_STOPPED);
        return;
    }

    nn_fsm_bad_state (handshaker->state, src, type);
}